

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cc
# Opt level: O3

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Triangle::SubEntities(Triangle *this,uint rel_codim)

{
  runtime_error *this_00;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sVar1;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (rel_codim < 3) {
    sVar1._M_extent._M_extent_value = *(size_t *)(&DAT_001c8638 + (ulong)rel_codim * 8);
    sVar1._M_ptr = (pointer)((long)&(((Triangle *)(&this->nodes_ + -1))->super_Entity)._vptr_Entity
                            + *(long *)(&DAT_001c8620 + (ulong)rel_codim * 8));
    return sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Triangle: rel_codim out of range",0x20);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x5b,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::span<const Entity* const> Triangle::SubEntities(unsigned rel_codim) const {
  auto l = [&](auto i) -> const mesh::Entity& { return **i; };
  switch (rel_codim) {
    case 2:
      return {reinterpret_cast<const Entity* const*>(nodes_.data()), 3};
    case 1:
      return {reinterpret_cast<const Entity* const*>(edges_.data()), 3};
    case 0:
      return {&this_, 1};
    default:
      LF_VERIFY_MSG(false, "Triangle: rel_codim out of range");
  }
}